

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O2

bool __thiscall Rml::DataViewFor::Update(DataViewFor *this,DataModel *model)

{
  ElementList *this_00;
  pointer ppEVar1;
  pointer ppEVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  Element *this_01;
  ulong uVar7;
  String *instancer_name;
  String *tag;
  Element *pEVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  initializer_list<Rml::DataAddressEntry> __l;
  allocator_type local_1e3;
  allocator<char> local_1e2;
  allocator<char> local_1e1;
  ElementPtr new_element_ptr;
  DataAddress iterator_address;
  unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> local_1a0;
  DataAddress iterator_index_address;
  DataVariable variable;
  Element *new_element;
  EnableObserverPtr<Rml::Element> local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  int local_100;
  DataAddressEntry local_f8;
  undefined8 local_d0;
  _Alloc_hider local_c8;
  _Alloc_hider local_c0 [3];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  Element *local_98;
  vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> local_88;
  String local_70;
  String local_50;
  
  variable = DataModel::GetVariable(model,&this->container_address);
  if (variable.definition != (VariableDefinition *)0x0) {
    uVar5 = DataVariable::Size(&variable);
    this_00 = &this->elements;
    ppEVar1 = (this->elements).super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppEVar2 = (this->elements).super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    this_01 = DataView::GetElement(&this->super_DataView);
    uVar9 = (uint)((ulong)((long)ppEVar1 - (long)ppEVar2) >> 3);
    uVar6 = uVar9;
    if ((int)uVar9 < (int)uVar5) {
      uVar6 = uVar5;
    }
    uVar10 = 0;
    uVar7 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar7 = uVar10;
    }
    for (; uVar10 != uVar7; uVar10 = uVar10 + 1) {
      if ((long)(int)uVar9 <= (long)uVar10) {
        instancer_name = Element::GetTagName_abi_cxx11_(this_01);
        tag = Element::GetTagName_abi_cxx11_(this_01);
        Factory::InstanceElement
                  ((Factory *)&new_element_ptr,(Element *)0x0,instancer_name,tag,&this->attributes);
        iterator_address.
        super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        iterator_address.
        super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        iterator_address.
        super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::reserve
                  (&iterator_address,
                   ((long)(this->container_address).
                          super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->container_address).
                         super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x28 + 1);
        ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::operator=
                  (&iterator_address,&this->container_address);
        new_element = (Element *)&local_110;
        local_118.block = (ObserverPtrBlock *)0x0;
        local_110._M_local_buf[0] = '\0';
        local_100 = (int)uVar10;
        ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::
        emplace_back<Rml::DataAddressEntry>(&iterator_address,(DataAddressEntry *)&new_element);
        ::std::__cxx11::string::~string((string *)&new_element);
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"literal",&local_1e1);
        DataAddressEntry::DataAddressEntry((DataAddressEntry *)&new_element,&local_50);
        ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"int",&local_1e2);
        DataAddressEntry::DataAddressEntry(&local_f8,&local_70);
        local_d0 = local_c0;
        local_c8._M_p = (pointer)0x0;
        local_c0[0]._M_p._0_1_ = 0;
        __l._M_len = 3;
        __l._M_array = (DataAddressEntry *)&new_element;
        local_c0[2]._M_p._0_4_ = (int)uVar10;
        ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::vector
                  (&iterator_index_address,__l,&local_1e3);
        lVar11 = 0x50;
        do {
          ::std::__cxx11::string::~string((string *)((long)&new_element + lVar11));
          lVar11 = lVar11 + -0x28;
        } while (lVar11 != -0x28);
        ::std::__cxx11::string::~string((string *)&local_70);
        ::std::__cxx11::string::~string((string *)&local_50);
        local_88.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
        _M_impl.super__Vector_impl_data._M_start =
             iterator_address.
             super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
             _M_impl.super__Vector_impl_data._M_start;
        local_88.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             iterator_address.
             super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_88.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             iterator_address.
             super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        iterator_address.
        super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        iterator_address.
        super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        iterator_address.
        super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        DataModel::InsertAlias
                  (model,(Element *)
                         new_element_ptr._M_t.
                         super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                         super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                         super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,
                   &this->iterator_name,&local_88);
        ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector
                  (&local_88);
        local_a8._M_allocated_capacity =
             (size_type)
             iterator_index_address.
             super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
             _M_impl.super__Vector_impl_data._M_start;
        local_a8._8_8_ =
             iterator_index_address.
             super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_98 = (Element *)
                   iterator_index_address.
                   super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        iterator_index_address.
        super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        iterator_index_address.
        super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        iterator_index_address.
        super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        DataModel::InsertAlias
                  (model,(Element *)
                         new_element_ptr._M_t.
                         super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                         super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                         super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,
                   &this->iterator_index_name,(DataAddress *)&local_a8);
        ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector
                  ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)
                   &local_a8);
        pEVar8 = Element::GetParentNode(this_01);
        local_1a0._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
        super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
        super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl =
             new_element_ptr._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
             _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
             super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
        new_element_ptr._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
        super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
        super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl =
             (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
             (__uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>)0x0;
        pEVar8 = Element::InsertBefore(pEVar8,&local_1a0,this_01);
        ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&local_1a0);
        new_element = pEVar8;
        ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::push_back
                  (this_00,&new_element);
        Element::SetInnerRML
                  ((this_00->super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar10],&this->rml_contents);
        if (((long)(int)((ulong)((long)(this->elements).
                                       super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->elements).
                                      super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) <=
             (long)uVar10) &&
           (bVar4 = Assert("RMLUI_ASSERT(i < (int)elements.size())",
                           "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataViewDefault.cpp"
                           ,0x228), !bVar4)) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector
                  (&iterator_index_address);
        ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector
                  (&iterator_address);
        ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&new_element_ptr)
        ;
      }
      if ((long)(int)uVar5 <= (long)uVar10) {
        DataModel::EraseAliases
                  (model,(this_00->
                         super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>).
                         _M_impl.super__Vector_impl_data._M_start[uVar10]);
        pEVar8 = Element::GetParentNode
                           ((this_00->
                            super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>).
                            _M_impl.super__Vector_impl_data._M_start[uVar10]);
        Element::RemoveChild((Element *)&new_element,pEVar8);
        ::std::__uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>::reset
                  ((__uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_> *)&new_element,
                   (pointer)0x0);
        ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr
                  ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)&new_element);
        (this_00->super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar10] = (Element *)0x0;
      }
    }
    if ((int)uVar5 < (int)uVar9) {
      ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::resize
                (this_00,(long)(int)uVar5);
    }
  }
  return false;
}

Assistant:

bool DataViewFor::Update(DataModel& model)
{
	DataVariable variable = model.GetVariable(container_address);
	if (!variable)
		return false;

	bool result = false;
	const int size = variable.Size();
	const int num_elements = (int)elements.size();
	Element* element = GetElement();

	for (int i = 0; i < Math::Max(size, num_elements); i++)
	{
		if (i >= num_elements)
		{
			ElementPtr new_element_ptr = Factory::InstanceElement(nullptr, element->GetTagName(), element->GetTagName(), attributes);

			DataAddress iterator_address;
			iterator_address.reserve(container_address.size() + 1);
			iterator_address = container_address;
			iterator_address.push_back(DataAddressEntry(i));

			DataAddress iterator_index_address = {{"literal"}, {"int"}, {i}};

			model.InsertAlias(new_element_ptr.get(), iterator_name, std::move(iterator_address));
			model.InsertAlias(new_element_ptr.get(), iterator_index_name, std::move(iterator_index_address));

			Element* new_element = element->GetParentNode()->InsertBefore(std::move(new_element_ptr), element);
			elements.push_back(new_element);

			elements[i]->SetInnerRML(rml_contents);

			RMLUI_ASSERT(i < (int)elements.size());
		}
		if (i >= size)
		{
			model.EraseAliases(elements[i]);
			elements[i]->GetParentNode()->RemoveChild(elements[i]).reset();
			elements[i] = nullptr;
		}
	}

	if (num_elements > size)
		elements.resize(size);

	return result;
}